

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
          (ShaderPerformanceCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,PerfCaseType caseType)

{
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,NODETYPE_PERFORMANCE,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderPerformanceCase_0079ae10;
  this->m_renderCtx = renderCtx;
  this->m_caseType = caseType;
  (this->m_vertShaderSource)._M_dataplus._M_p = (pointer)&(this->m_vertShaderSource).field_2;
  (this->m_vertShaderSource)._M_string_length = 0;
  (this->m_vertShaderSource).field_2._M_local_buf[0] = '\0';
  (this->m_fragShaderSource)._M_dataplus._M_p = (pointer)&(this->m_fragShaderSource).field_2;
  (this->m_fragShaderSource)._M_string_length = 0;
  (this->m_fragShaderSource).field_2._M_local_buf[0] = '\0';
  (this->m_attributes).
  super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_attributes).
  super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_attributes).
  super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_program = (ShaderProgram *)0x0;
  ShaderPerformanceMeasurer::ShaderPerformanceMeasurer(&this->m_measurer,renderCtx,caseType);
  (this->m_initialCalibration).m_ptr = (InitialCalibration *)0x0;
  (this->m_initialCalibration).m_state = (SharedPtrStateBase *)0x0;
  return;
}

Assistant:

ShaderPerformanceCase::ShaderPerformanceCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, PerfCaseType caseType)
	: tcu::TestCase		(testCtx, tcu::NODETYPE_PERFORMANCE, name, description)
	, m_renderCtx		(renderCtx)
	, m_caseType		(caseType)
	, m_program			(DE_NULL)
	, m_measurer		(renderCtx, caseType)
{
}